

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall
cmDependsFortran::WriteDependencies
          (cmDependsFortran *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *param_3,ostream *param_4)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  reference src_00;
  char *fname;
  ostream *poVar4;
  byte local_329;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  cmFortranCompiler local_2e0;
  undefined1 local_280 [8];
  cmFortranParser parser;
  cmFortranSourceInfo *info;
  string *src;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool okay;
  undefined1 local_a0 [8];
  cmFortranCompiler fc;
  ostream *param_4_local;
  ostream *param_3_local;
  string *obj_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *sources_local;
  cmDependsFortran *this_local;
  
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(sources);
  local_329 = 1;
  if (!bVar1) {
    fc.SModExt.field_2._8_8_ =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(sources);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&fc.SModExt.field_2 + 8));
    local_329 = std::__cxx11::string::empty();
  }
  if ((local_329 & 1) == 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmFortranCompiler::cmFortranCompiler((cmFortranCompiler *)local_a0);
      std::__cxx11::string::operator=((string *)local_a0,(string *)&this->CompilerId);
      std::__cxx11::string::operator=
                ((string *)(fc.Id.field_2._M_local_buf + 8),(string *)&this->SModSep);
      std::__cxx11::string::operator=
                ((string *)(fc.SModSep.field_2._M_local_buf + 8),(string *)&this->SModExt);
      __range1._3_1_ = true;
      __end1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(sources);
      src = (string *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(sources);
      while( true ) {
        bVar1 = std::operator!=(&__end1,(_Self *)&src);
        if (!bVar1) break;
        src_00 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1);
        parser.Info = cmDependsFortranInternals::CreateObjectInfo(this->Internal,obj,src_00);
        cmFortranCompiler::cmFortranCompiler(&local_2e0,(cmFortranCompiler *)local_a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_2f8,&(this->super_cmDepends).IncludePath);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set(&local_328,&this->PPDefinitions);
        cmFortranParser_s::cmFortranParser_s
                  ((cmFortranParser_s *)local_280,&local_2e0,&local_2f8,&local_328,parser.Info);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set(&local_328);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2f8);
        cmFortranCompiler::~cmFortranCompiler(&local_2e0);
        fname = (char *)std::__cxx11::string::c_str();
        cmFortranParser_FilePush((cmFortranParser *)local_280,fname);
        iVar2 = cmFortran_yyparse(parser.IncludePath.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (iVar2 != 0) {
          __range1._3_1_ = false;
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "warning: failed to parse dependencies from Fortran source \'");
          poVar4 = std::operator<<(poVar4,(string *)src_00);
          poVar4 = std::operator<<(poVar4,"\': ");
          poVar4 = std::operator<<(poVar4,(string *)(parser.TokenString.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        cmFortranParser_s::~cmFortranParser_s((cmFortranParser_s *)local_280);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = __range1._3_1_;
      cmFortranCompiler::~cmFortranCompiler((cmFortranCompiler *)local_a0);
    }
    else {
      cmSystemTools::Error
                ("Cannot scan dependencies without an object file.",(char *)0x0,(char *)0x0,
                 (char *)0x0);
      this_local._7_1_ = false;
    }
  }
  else {
    cmSystemTools::Error
              ("Cannot scan dependencies without a source file.",(char *)0x0,(char *)0x0,(char *)0x0
              );
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmDependsFortran::WriteDependencies(const std::set<std::string>& sources,
                                         const std::string& obj,
                                         std::ostream& /*makeDepends*/,
                                         std::ostream& /*internalDepends*/)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  cmFortranCompiler fc;
  fc.Id = this->CompilerId;
  fc.SModSep = this->SModSep;
  fc.SModExt = this->SModExt;

  bool okay = true;
  for (std::string const& src : sources) {
    // Get the information object for this source.
    cmFortranSourceInfo& info = this->Internal->CreateObjectInfo(obj, src);

    // Create the parser object. The constructor takes info by reference,
    // so we may look into the resulting objects later.
    cmFortranParser parser(fc, this->IncludePath, this->PPDefinitions, info);

    // Push on the starting file.
    cmFortranParser_FilePush(&parser, src.c_str());

    // Parse the translation unit.
    if (cmFortran_yyparse(parser.Scanner) != 0) {
      // Failed to parse the file.  Report failure to write dependencies.
      okay = false;
      /* clang-format off */
      std::cerr <<
        "warning: failed to parse dependencies from Fortran source "
        "'" << src << "': " << parser.Error << std::endl
        ;
      /* clang-format on */
    }
  }
  return okay;
}